

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O0

TCGv_i64 do_last_scalar(DisasContext_conflict1 *s,int esz,int pg,int rm,_Bool before)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_i32 ret_00;
  TCGv_i64 pTVar1;
  TCGv_i64 ret;
  TCGv_i32 last;
  TCGContext_conflict1 *tcg_ctx;
  _Bool before_local;
  int rm_local;
  int pg_local;
  int esz_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  ret_00 = tcg_temp_new_i32(tcg_ctx_00);
  find_last_active(s,ret_00,esz,pg);
  if (before) {
    wrap_last_active(s,ret_00,esz);
  }
  else {
    incr_last_active(s,ret_00,esz);
  }
  pTVar1 = load_last_active(s,ret_00,rm,esz);
  tcg_temp_free_i32(tcg_ctx_00,ret_00);
  return pTVar1;
}

Assistant:

static TCGv_i64 do_last_scalar(DisasContext *s, int esz,
                               int pg, int rm, bool before)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 last = tcg_temp_new_i32(tcg_ctx);
    TCGv_i64 ret;

    find_last_active(s, last, esz, pg);
    if (before) {
        wrap_last_active(s, last, esz);
    } else {
        incr_last_active(s, last, esz);
    }

    ret = load_last_active(s, last, rm, esz);
    tcg_temp_free_i32(tcg_ctx, last);
    return ret;
}